

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

int set_bucket_realloc(set s)

{
  ulong uVar1;
  size_t sVar2;
  bucket pbVar3;
  long lVar4;
  ulong *in_RDI;
  float fVar5;
  float fVar6;
  bucket b;
  size_t iterator;
  float ratio;
  size_t prime;
  set_type new_set;
  float fVar7;
  set_cb_iterate_args args;
  float fVar8;
  set in_stack_ffffffffffffffa0;
  ulong local_58;
  size_t local_48;
  int local_4;
  
  uVar1 = in_RDI[2];
  args = (set_cb_iterate_args)in_RDI[1];
  fVar5 = (float)(long)*in_RDI;
  fVar8 = (float)*in_RDI;
  fVar6 = (float)(long)args;
  fVar7 = (float)args;
  if ((uVar1 == 0) || (0.1 < fVar8 / fVar7)) {
    if (fVar8 / fVar7 < 0.77) {
      return 0;
    }
    local_48 = uVar1 + 1;
  }
  else {
    local_48 = uVar1 - 1;
  }
  sVar2 = bucket_capacity(local_48);
  pbVar3 = bucket_create(CONCAT44(fVar7,fVar6));
  if (pbVar3 == (bucket)0x0) {
    local_4 = 1;
  }
  else {
    set_iterate(in_stack_ffffffffffffffa0,(set_cb_iterate)CONCAT44(fVar8,fVar5),args);
    for (local_58 = 0; local_58 < in_RDI[1]; local_58 = local_58 + 1) {
      lVar4 = in_RDI[3] + local_58 * 0x18;
      if (*(long *)(lVar4 + 0x10) != 0) {
        free(*(void **)(lVar4 + 0x10));
      }
    }
    free((void *)in_RDI[3]);
    in_RDI[1] = sVar2;
    in_RDI[2] = local_48;
    in_RDI[3] = (ulong)pbVar3;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int set_bucket_realloc(set s)
{
	struct set_type new_set;
	size_t prime = s->prime;
	float ratio = (float)((float)s->count / (float)s->capacity);

	if (prime > 0 && ratio <= SET_BUCKET_RATIO_MIN)
	{
		--prime;
	}
	else if (ratio >= SET_BUCKET_RATIO_MAX)
	{
		++prime;
	}
	else
	{
		return 0;
	}

	new_set.hash_cb = s->hash_cb;
	new_set.compare_cb = s->compare_cb;
	new_set.count = 0;
	new_set.prime = prime;
	new_set.capacity = bucket_capacity(prime);
	new_set.buckets = bucket_create(new_set.capacity);

	if (new_set.buckets != NULL)
	{
		size_t iterator;

		set_iterate(s, &set_bucket_realloc_iterator, &new_set);

		for (iterator = 0; iterator < s->capacity; ++iterator)
		{
			bucket b = &s->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(s->buckets);

		s->capacity = new_set.capacity;
		s->prime = new_set.prime;
		s->buckets = new_set.buckets;

		return 0;
	}

	return 1;
}